

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  Cord *this_00;
  bool bVar1;
  uint32_t number;
  CppType CVar2;
  CppStringType CVar3;
  FieldDescriptor *pFVar4;
  Arena *pAVar5;
  Cord **ppCVar6;
  MicroString *this_01;
  ArenaStringPtr *this_02;
  Message **ppMVar7;
  uint32_t *puVar8;
  FieldDescriptor *field;
  uint32_t oneof_case;
  OneofDescriptor *oneof_descriptor_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    pFVar4 = OneofDescriptor::field(oneof_descriptor,0);
    ClearField(this,message,pFVar4);
    return;
  }
  number = GetOneofCase(this,message,oneof_descriptor);
  if (number == 0) {
    return;
  }
  pFVar4 = Descriptor::FindFieldByNumber(this->descriptor_,number);
  pAVar5 = MessageLite::GetArena(&message->super_MessageLite);
  if (pAVar5 == (Arena *)0x0) {
    CVar2 = FieldDescriptor::cpp_type(pFVar4);
    if (CVar2 == CPPTYPE_STRING) {
      CVar3 = FieldDescriptor::cpp_string_type(pFVar4);
      if (CVar3 != kView) {
        if (CVar3 == kCord) {
          ppCVar6 = MutableRaw<absl::lts_20250127::Cord*>(this,message,pFVar4);
          this_00 = *ppCVar6;
          if (this_00 != (Cord *)0x0) {
            absl::lts_20250127::Cord::~Cord(this_00);
            operator_delete(this_00,0x10);
          }
          goto LAB_003a3eb9;
        }
        if (CVar3 != kString) goto LAB_003a3eb9;
      }
      bVar1 = IsMicroString(this,pFVar4);
      if (bVar1) {
        this_01 = MutableField<google::protobuf::internal::MicroString>(this,message,pFVar4);
        internal::MicroString::Destroy(this_01);
      }
      else {
        this_02 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,pFVar4);
        internal::ArenaStringPtr::Destroy(this_02);
      }
    }
    else if (CVar2 == CPPTYPE_MESSAGE) {
      ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,pFVar4);
      if (*ppMVar7 != (Message *)0x0) {
        (*((*ppMVar7)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
  }
LAB_003a3eb9:
  puVar8 = MutableOneofCase(this,message,oneof_descriptor);
  *puVar8 = 0;
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    ClearField(message, oneof_descriptor->field(0));
    return;
  }
  // TODO: Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32_t oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (message->GetArena() == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *MutableRaw<absl::Cord*>(message, field);
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsMicroString(field)) {
                MutableField<MicroString>(message, field)->Destroy();
              } else {
                // Oneof string fields are never set as a default instance.
                // We just need to pass some arbitrary default string to make it
                // work. This allows us to not have the real default accessible
                // from reflection.
                MutableField<ArenaStringPtr>(message, field)->Destroy();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}